

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O0

Omega_h_Family Omega_h::gmsh::anon_unknown_0::type_family(Int type)

{
  Int type_local;
  
  if (1 < type - 1U) {
    if (type == 3) {
      return OMEGA_H_HYPERCUBE;
    }
    if (type != 4) {
      if (type == 5) {
        return OMEGA_H_HYPERCUBE;
      }
      if (type != 0xf) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x40);
      }
    }
  }
  return OMEGA_H_SIMPLEX;
}

Assistant:

Omega_h_Family type_family(Int type) {
  switch (type) {
    case GMSH_VERT:
    case GMSH_LINE:
    case GMSH_TRI:
    case GMSH_TET:
      return OMEGA_H_SIMPLEX;
    case GMSH_QUAD:
    case GMSH_HEX:
      return OMEGA_H_HYPERCUBE;
  }
  OMEGA_H_NORETURN(Omega_h_Family());
}